

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  
  auVar67 = _DAT_0011a070;
  auVar66 = _DAT_0011a060;
  if (len < 0x20) {
    uVar70 = 0;
  }
  else {
    uVar69 = 0;
    uVar68 = 4;
    do {
      uVar70 = uVar68;
      lVar71 = 0x20;
      auVar74 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar69 * 8),auVar66,
                                  *(undefined1 (*) [16])(array + uVar69 * 8 + 8));
      auVar75 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar69 * 8 + 8),auVar67,
                                  *(undefined1 (*) [16])(array + uVar69 * 8));
      auVar72 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar69 * 8 + 0x10),auVar66,
                                  *(undefined1 (*) [16])(array + uVar69 * 8 + 0x18));
      auVar73 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar69 * 8 + 0x18),auVar67,
                                  *(undefined1 (*) [16])(array + uVar69 * 8 + 0x10));
      do {
        auVar2 = auVar74 >> 7;
        auVar21 = auVar74 >> 0xf;
        auVar41 = auVar74 >> 0x17;
        auVar61 = auVar74 >> 0x1f;
        auVar7 = auVar74 >> 0x27;
        auVar12 = auVar74 >> 0x2f;
        auVar17 = auVar74 >> 0x37;
        auVar22 = auVar74 >> 0x3f;
        auVar27 = auVar74 >> 0x47;
        auVar32 = auVar74 >> 0x4f;
        auVar37 = auVar74 >> 0x57;
        auVar42 = auVar74 >> 0x5f;
        auVar47 = auVar74 >> 0x67;
        auVar52 = auVar74 >> 0x6f;
        auVar57 = auVar74 >> 0x77;
        bVar62 = auVar74[0xf];
        auVar6 = auVar75 >> 7;
        auVar26 = auVar75 >> 0xf;
        auVar46 = auVar75 >> 0x17;
        auVar3 = auVar75 >> 0x1f;
        auVar8 = auVar75 >> 0x27;
        auVar13 = auVar75 >> 0x2f;
        auVar18 = auVar75 >> 0x37;
        auVar23 = auVar75 >> 0x3f;
        auVar28 = auVar75 >> 0x47;
        auVar33 = auVar75 >> 0x4f;
        auVar38 = auVar75 >> 0x57;
        auVar43 = auVar75 >> 0x5f;
        auVar48 = auVar75 >> 0x67;
        auVar53 = auVar75 >> 0x6f;
        auVar58 = auVar75 >> 0x77;
        bVar63 = auVar75[0xf];
        auVar11 = auVar72 >> 7;
        auVar31 = auVar72 >> 0xf;
        auVar51 = auVar72 >> 0x17;
        auVar4 = auVar72 >> 0x1f;
        auVar9 = auVar72 >> 0x27;
        auVar14 = auVar72 >> 0x2f;
        auVar19 = auVar72 >> 0x37;
        auVar24 = auVar72 >> 0x3f;
        auVar29 = auVar72 >> 0x47;
        auVar34 = auVar72 >> 0x4f;
        auVar39 = auVar72 >> 0x57;
        auVar44 = auVar72 >> 0x5f;
        auVar49 = auVar72 >> 0x67;
        auVar54 = auVar72 >> 0x6f;
        auVar59 = auVar72 >> 0x77;
        bVar64 = auVar72[0xf];
        auVar74 = vpaddb_avx(auVar74,auVar74);
        auVar75 = vpaddb_avx(auVar75,auVar75);
        auVar72 = vpaddb_avx(auVar72,auVar72);
        auVar16 = auVar73 >> 7;
        auVar36 = auVar73 >> 0xf;
        auVar56 = auVar73 >> 0x17;
        auVar5 = auVar73 >> 0x1f;
        auVar10 = auVar73 >> 0x27;
        auVar15 = auVar73 >> 0x2f;
        auVar20 = auVar73 >> 0x37;
        auVar25 = auVar73 >> 0x3f;
        auVar30 = auVar73 >> 0x47;
        auVar35 = auVar73 >> 0x4f;
        auVar40 = auVar73 >> 0x57;
        auVar45 = auVar73 >> 0x5f;
        auVar50 = auVar73 >> 0x67;
        auVar55 = auVar73 >> 0x6f;
        auVar60 = auVar73 >> 0x77;
        bVar65 = auVar73[0xf];
        auVar73 = vpaddb_avx(auVar73,auVar73);
        *(int *)((long)flags + lVar71 + -4) =
             POPCOUNT((uint)(ushort)((ushort)(auVar11[0] & 1) | (ushort)(auVar31[0] & 1) << 1 |
                                     (ushort)(auVar51[0] & 1) << 2 | (ushort)(auVar4[0] & 1) << 3 |
                                     (ushort)(auVar9[0] & 1) << 4 | (ushort)(auVar14[0] & 1) << 5 |
                                     (ushort)(auVar19[0] & 1) << 6 | (ushort)(auVar24[0] & 1) << 7 |
                                     (ushort)(auVar29[0] & 1) << 8 | (ushort)(auVar34[0] & 1) << 9 |
                                     (ushort)(auVar39[0] & 1) << 10 |
                                     (ushort)(auVar44[0] & 1) << 0xb |
                                     (ushort)(auVar49[0] & 1) << 0xc |
                                     (ushort)(auVar54[0] & 1) << 0xd |
                                     (ushort)(auVar59[0] & 1) << 0xe | (ushort)(bVar64 >> 7) << 0xf)
                     ) +
             POPCOUNT((uint)(ushort)((ushort)(auVar2[0] & 1) | (ushort)(auVar21[0] & 1) << 1 |
                                     (ushort)(auVar41[0] & 1) << 2 | (ushort)(auVar61[0] & 1) << 3 |
                                     (ushort)(auVar7[0] & 1) << 4 | (ushort)(auVar12[0] & 1) << 5 |
                                     (ushort)(auVar17[0] & 1) << 6 | (ushort)(auVar22[0] & 1) << 7 |
                                     (ushort)(auVar27[0] & 1) << 8 | (ushort)(auVar32[0] & 1) << 9 |
                                     (ushort)(auVar37[0] & 1) << 10 |
                                     (ushort)(auVar42[0] & 1) << 0xb |
                                     (ushort)(auVar47[0] & 1) << 0xc |
                                     (ushort)(auVar52[0] & 1) << 0xd |
                                     (ushort)(auVar57[0] & 1) << 0xe | (ushort)(bVar62 >> 7) << 0xf)
                     ) + *(int *)((long)flags + lVar71 + -4);
        *(int *)((long)flags + lVar71 + 0x1c) =
             POPCOUNT((uint)(ushort)((ushort)(auVar16[0] & 1) | (ushort)(auVar36[0] & 1) << 1 |
                                     (ushort)(auVar56[0] & 1) << 2 | (ushort)(auVar5[0] & 1) << 3 |
                                     (ushort)(auVar10[0] & 1) << 4 | (ushort)(auVar15[0] & 1) << 5 |
                                     (ushort)(auVar20[0] & 1) << 6 | (ushort)(auVar25[0] & 1) << 7 |
                                     (ushort)(auVar30[0] & 1) << 8 | (ushort)(auVar35[0] & 1) << 9 |
                                     (ushort)(auVar40[0] & 1) << 10 |
                                     (ushort)(auVar45[0] & 1) << 0xb |
                                     (ushort)(auVar50[0] & 1) << 0xc |
                                     (ushort)(auVar55[0] & 1) << 0xd |
                                     (ushort)(auVar60[0] & 1) << 0xe | (ushort)(bVar65 >> 7) << 0xf)
                     ) +
             POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar26[0] & 1) << 1 |
                                     (ushort)(auVar46[0] & 1) << 2 | (ushort)(auVar3[0] & 1) << 3 |
                                     (ushort)(auVar8[0] & 1) << 4 | (ushort)(auVar13[0] & 1) << 5 |
                                     (ushort)(auVar18[0] & 1) << 6 | (ushort)(auVar23[0] & 1) << 7 |
                                     (ushort)(auVar28[0] & 1) << 8 | (ushort)(auVar33[0] & 1) << 9 |
                                     (ushort)(auVar38[0] & 1) << 10 |
                                     (ushort)(auVar43[0] & 1) << 0xb |
                                     (ushort)(auVar48[0] & 1) << 0xc |
                                     (ushort)(auVar53[0] & 1) << 0xd |
                                     (ushort)(auVar58[0] & 1) << 0xe | (ushort)(bVar63 >> 7) << 0xf)
                     ) + *(int *)((long)flags + lVar71 + 0x1c);
        lVar71 = lVar71 + -4;
      } while (lVar71 != 0);
      uVar69 = uVar70;
      uVar68 = uVar70 + 4;
    } while (uVar70 + 4 <= (ulong)(len >> 3));
  }
  auVar67 = _DAT_0011a070;
  auVar66 = _DAT_0011a060;
  uVar69 = uVar70 | 2;
  while (uVar68 = uVar69, uVar68 <= len >> 3) {
    lVar71 = 0x20;
    auVar74 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar70 * 8),auVar66,
                                *(undefined1 (*) [16])(array + uVar70 * 8 + 8));
    auVar75 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar70 * 8 + 8),auVar67,
                                *(undefined1 (*) [16])(array + uVar70 * 8));
    do {
      auVar72 = auVar74 >> 7;
      auVar73 = auVar74 >> 0xf;
      auVar2 = auVar74 >> 0x17;
      auVar6 = auVar74 >> 0x1f;
      auVar11 = auVar74 >> 0x27;
      auVar16 = auVar74 >> 0x2f;
      auVar21 = auVar74 >> 0x37;
      auVar26 = auVar74 >> 0x3f;
      auVar31 = auVar74 >> 0x47;
      auVar36 = auVar74 >> 0x4f;
      auVar41 = auVar74 >> 0x57;
      auVar46 = auVar74 >> 0x5f;
      auVar51 = auVar74 >> 0x67;
      auVar56 = auVar74 >> 0x6f;
      auVar61 = auVar74 >> 0x77;
      bVar62 = auVar74[0xf];
      auVar74 = vpaddb_avx(auVar74,auVar74);
      piVar1 = (int *)((long)flags + lVar71 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar72[0] & 1) |
                                                  (ushort)(auVar73[0] & 1) << 1 |
                                                  (ushort)(auVar2[0] & 1) << 2 |
                                                  (ushort)(auVar6[0] & 1) << 3 |
                                                  (ushort)(auVar11[0] & 1) << 4 |
                                                  (ushort)(auVar16[0] & 1) << 5 |
                                                  (ushort)(auVar21[0] & 1) << 6 |
                                                  (ushort)(auVar26[0] & 1) << 7 |
                                                  (ushort)(auVar31[0] & 1) << 8 |
                                                  (ushort)(auVar36[0] & 1) << 9 |
                                                  (ushort)(auVar41[0] & 1) << 10 |
                                                  (ushort)(auVar46[0] & 1) << 0xb |
                                                  (ushort)(auVar51[0] & 1) << 0xc |
                                                  (ushort)(auVar56[0] & 1) << 0xd |
                                                  (ushort)(auVar61[0] & 1) << 0xe |
                                                 (ushort)(bVar62 >> 7) << 0xf));
      auVar72 = auVar75 >> 7;
      auVar73 = auVar75 >> 0xf;
      auVar2 = auVar75 >> 0x17;
      auVar6 = auVar75 >> 0x1f;
      auVar11 = auVar75 >> 0x27;
      auVar16 = auVar75 >> 0x2f;
      auVar21 = auVar75 >> 0x37;
      auVar26 = auVar75 >> 0x3f;
      auVar31 = auVar75 >> 0x47;
      auVar36 = auVar75 >> 0x4f;
      auVar41 = auVar75 >> 0x57;
      auVar46 = auVar75 >> 0x5f;
      auVar51 = auVar75 >> 0x67;
      auVar56 = auVar75 >> 0x6f;
      auVar61 = auVar75 >> 0x77;
      bVar62 = auVar75[0xf];
      auVar75 = vpaddb_avx(auVar75,auVar75);
      piVar1 = (int *)((long)flags + lVar71 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar72[0] & 1) |
                                                  (ushort)(auVar73[0] & 1) << 1 |
                                                  (ushort)(auVar2[0] & 1) << 2 |
                                                  (ushort)(auVar6[0] & 1) << 3 |
                                                  (ushort)(auVar11[0] & 1) << 4 |
                                                  (ushort)(auVar16[0] & 1) << 5 |
                                                  (ushort)(auVar21[0] & 1) << 6 |
                                                  (ushort)(auVar26[0] & 1) << 7 |
                                                  (ushort)(auVar31[0] & 1) << 8 |
                                                  (ushort)(auVar36[0] & 1) << 9 |
                                                  (ushort)(auVar41[0] & 1) << 10 |
                                                  (ushort)(auVar46[0] & 1) << 0xb |
                                                  (ushort)(auVar51[0] & 1) << 0xc |
                                                  (ushort)(auVar56[0] & 1) << 0xd |
                                                  (ushort)(auVar61[0] & 1) << 0xe |
                                                 (ushort)(bVar62 >> 7) << 0xf));
      lVar71 = lVar71 + -4;
    } while (lVar71 != 0);
    uVar70 = uVar68;
    uVar69 = uVar68 + 2;
  }
  uVar70 = uVar70 << 3;
  if (uVar70 < len) {
    auVar76 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar77 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar78 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar70 = uVar70 + 1;
      auVar79 = vpbroadcastd_avx512f();
      auVar79 = vpsrlvd_avx512f(auVar79,auVar77);
      auVar79 = vpandd_avx512f(auVar79,auVar78);
      auVar76 = vpaddd_avx512f(auVar79,auVar76);
    } while (len != uVar70);
    auVar76 = vmovdqu64_avx512f(auVar76);
    *(undefined1 (*) [64])flags = auVar76;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m128i v##p =  _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}